

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateDxf.cpp
# Opt level: O3

void __thiscall CreateDxf::DxfBegin(CreateDxf *this,string *str)

{
  long *plVar1;
  ofstream To_Dxf;
  long local_208;
  filebuf local_200 [240];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(&local_208,(string *)str,_S_out);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&local_208,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"SECTION",7);
  std::ios::widen((char)&local_208 + (char)*(undefined8 *)(local_208 + -0x18));
  std::ostream::put((char)&local_208);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&local_208,2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ENTITIES",8);
  std::ios::widen((char)&local_208 + (char)*(undefined8 *)(local_208 + -0x18));
  std::ostream::put((char)&local_208);
  std::ostream::flush();
  std::ofstream::close();
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void  CreateDxf::DxfBegin (string &str)
{
	// Creation of an output stream object in text mode. Header section of every dxf file. 
	ofstream To_Dxf (str, ios::out);

	To_Dxf << 0		  << endl;
	To_Dxf << "SECTION"  << endl;
	To_Dxf << 2		  << endl;
	To_Dxf << "ENTITIES" << endl;

	To_Dxf.close();
}